

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternSelection.cpp
# Opt level: O1

TrackMeta __thiscall PatternSelection::Iterator::getTrackMeta(Iterator *this,int track)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  TrackMeta TVar5;
  
  uVar1 = 0;
  if ((this->mStart).super_PatternCursorBase.track == track) {
    uVar1 = (ulong)(uint)(this->mStart).super_PatternCursorBase.column;
  }
  uVar2 = 4;
  if ((this->mEnd).super_PatternCursorBase.track == track) {
    uVar2 = (this->mEnd).super_PatternCursorBase.column;
  }
  iVar3 = 2;
  if (2 < (int)uVar1) {
    iVar3 = (int)uVar1;
  }
  TVar5.mEffectStart = iVar3 + -2;
  uVar4 = 1;
  if (1 < (int)uVar2) {
    uVar4 = uVar2;
  }
  TVar5._0_8_ = uVar1 | (ulong)uVar2 << 0x20;
  TVar5.mEffectEnd = uVar4 - 1;
  return TVar5;
}

Assistant:

PatternSelection::TrackMeta PatternSelection::Iterator::getTrackMeta(int track) const {
    int start;
    int end;

    if (track == mStart.track) {
        start = mStart.column;
    } else {
        start = 0;
    }

    if (track == mEnd.track) {
        end = mEnd.column;
    } else {
        end = PatternAnchor::MAX_SELECTS - 1;
    }

    return { start, end };
}